

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscSystemFuncs.cpp
# Opt level: O3

Type * __thiscall
slang::ast::builtins::ClassRandomizeFunction::checkArguments
          (ClassRandomizeFunction *this,ASTContext *context,Args *args,SourceRange range,
          Expression *thisExpr)

{
  Compilation *pCVar1;
  size_t sVar2;
  Type *pTVar3;
  Expression *this_00;
  bool bVar4;
  Type *pTVar5;
  ClassType *pCVar6;
  Symbol *pSVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  long *plVar11;
  pair<const_slang::ast::ClassType_*,_bool> pVar12;
  
  pCVar1 = ((context->scope).ptr)->compilation;
  bVar4 = SystemSubroutine::checkArgCount
                    (&this->super_SystemSubroutine,context,thisExpr != (Expression *)0x0,args,range,
                     0,0x7fffffff);
  if (bVar4) {
    uVar8 = (ulong)(thisExpr != (Expression *)0x0);
    plVar11 = (long *)((ulong)((uint)(thisExpr != (Expression *)0x0) * 8) + (long)args->_M_ptr);
    sVar2 = (args->_M_extent)._M_extent_value;
    if (sVar2 - uVar8 == 1) {
      pTVar3 = *(Type **)(*plVar11 + 8);
      pTVar5 = pTVar3->canonical;
      if (pTVar5 == (Type *)0x0) {
        Type::resolveCanonical(pTVar3);
        pTVar5 = pTVar3->canonical;
      }
      lVar10 = 0x158;
      if ((pTVar5->super_Symbol).kind == NullType) goto LAB_003efbde;
    }
    if (thisExpr == (Expression *)0x0) {
      pVar12 = Lookup::getContainingClass((context->scope).ptr);
      pCVar6 = pVar12.first;
      if (pCVar6 == (ClassType *)0x0) goto LAB_003efbd8;
    }
    else {
      pTVar3 = (thisExpr->type).ptr;
      pCVar6 = (ClassType *)pTVar3->canonical;
      if (pCVar6 == (ClassType *)0x0) {
        Type::resolveCanonical(pTVar3);
        pCVar6 = (ClassType *)pTVar3->canonical;
      }
    }
    lVar10 = 0x158;
    if (sVar2 != uVar8) {
      lVar9 = 0;
      do {
        this_00 = *(Expression **)((long)plVar11 + lVar9);
        if ((((this_00->kind != NamedValue) ||
             (pSVar7 = Expression::getSymbolReference(this_00,true), pSVar7 == (Symbol *)0x0)) ||
            (pSVar7->kind != ClassProperty)) || (pSVar7->parentScope != &pCVar6->super_Scope)) {
          ASTContext::addDiag(context,(DiagCode)0x8000b,this_00->sourceRange);
          goto LAB_003efbd8;
        }
        lVar9 = lVar9 + 8;
      } while (sVar2 * 8 + uVar8 * -8 != lVar9);
    }
  }
  else {
LAB_003efbd8:
    lVar10 = 400;
  }
LAB_003efbde:
  return *(Type **)((long)&(pCVar1->super_BumpAllocator).head + lVar10);
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression* thisExpr) const final {
        bool isMethod = thisExpr != nullptr;
        auto& comp = context.getCompilation();
        if (!checkArgCount(context, isMethod, args, range, 0, INT32_MAX))
            return comp.getErrorType();

        Args methodArgs = args;
        if (isMethod)
            methodArgs = methodArgs.subspan(1);

        // Special case: a single 'null' argument can be passed to indicate
        // that no variables should be randomized.
        if (methodArgs.size() == 1 && methodArgs[0]->type->isNull())
            return comp.getIntType();

        // This can only be called via a special lookup on a class handle or as a local
        // class member, so we know either the this expression gives us the class type
        // or we can look it up from our current scope.
        const Scope* ct;
        if (thisExpr)
            ct = &thisExpr->type->getCanonicalType().as<ClassType>();
        else
            ct = Lookup::getContainingClass(*context.scope).first;

        if (!ct)
            return comp.getErrorType();

        for (auto arg : methodArgs) {
            if (arg->kind != ExpressionKind::NamedValue) {
                context.addDiag(diag::ExpectedClassPropertyName, arg->sourceRange);
                return comp.getErrorType();
            }

            auto sym = arg->getSymbolReference();
            if (!sym || sym->kind != SymbolKind::ClassProperty || sym->getParentScope() != ct) {
                context.addDiag(diag::ExpectedClassPropertyName, arg->sourceRange);
                return comp.getErrorType();
            }
        }

        return comp.getIntType();
    }